

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  void **__base;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  size_t sVar5;
  Abc_Obj_t *pAVar6;
  char *pName;
  long lVar7;
  int iVar8;
  int i;
  size_t __nmemb;
  
  p = Vec_PtrAlloc(100);
  iVar8 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar8) {
      iVar8 = p->nSize;
      __nmemb = (size_t)iVar8;
      if (1 < (long)__nmemb) {
        __base = p->pArray;
        qsort(__base,__nmemb,8,Abc_ObjPointerCompare);
        iVar8 = 1;
        for (sVar5 = 1; __nmemb != sVar5; sVar5 = sVar5 + 1) {
          if (__base[sVar5] != __base[sVar5 - 1]) {
            lVar7 = (long)iVar8;
            iVar8 = iVar8 + 1;
            __base[lVar7] = __base[sVar5];
          }
        }
        p->nSize = iVar8;
      }
      i = 0;
      iVar2 = 0;
      if (0 < iVar8) {
        iVar2 = iVar8;
      }
      for (; iVar2 != i; i = i + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
        pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        pName = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar6,pName,(char *)0x0);
        Abc_NodeSetTravIdCurrent(pAVar6);
        Abc_ObjTransferFanout(pAVar4,pAVar6);
      }
      Vec_PtrFree(p);
      return iVar8;
    }
    pAVar4 = Abc_NtkObj(pNtk,iVar8);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      iVar2 = Abc_NodeIsTravIdCurrent(pAVar4);
      if (iVar2 != 0) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          pAVar6 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]];
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar6);
          if (iVar2 == 0) {
            iVar2 = Abc_NtkCheckConstant_rec(pAVar6);
            if (iVar2 == -1) {
              uVar3 = *(uint *)&pAVar6->field_0x14;
              if ((uVar3 & 0xf) == 5) {
                plVar1 = (long *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
                iVar2 = Abc_NtkCheckConstant_rec
                                  (*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[4] * 8));
                if (iVar2 != -1) goto LAB_002c5fc0;
                uVar3 = *(uint *)&pAVar6->field_0x14;
              }
              if ((uVar3 & 0xf) == 8) {
                __assert_fail("!Abc_ObjIsLatch(pFanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                              ,0x377,"int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *)");
              }
              Vec_PtrPush(p,pAVar6);
            }
            else {
LAB_002c5fc0:
              Abc_NtkSetTravId_rec(pAVar6);
            }
          }
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Abc_NtkReplaceAutonomousLogic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k, Counter;
    // collect the nodes that feed into the reachable logic
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        // skip non-visited fanins
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
            continue;
        // look for non-visited fanins
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            // skip visited fanins
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            // skip constants and latches fed by constants
            if ( Abc_NtkCheckConstant_rec(pFanin) != -1 ||
                 (Abc_ObjIsBo(pFanin) && Abc_NtkCheckConstant_rec(Abc_ObjFanin0(Abc_ObjFanin0(pFanin))) != -1) )
            {
                Abc_NtkSetTravId_rec( pFanin );
                continue;
            }
            assert( !Abc_ObjIsLatch(pFanin) );
            Vec_PtrPush( vNodes, pFanin );
        }
    }
    Vec_PtrUniqify( vNodes, (int (*)(void))Abc_ObjPointerCompare );
    // replace these nodes by the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pFanin = Abc_NtkCreatePi(pNtk);
        Abc_ObjAssignName( pFanin, Abc_ObjName(pFanin), NULL );
        Abc_NodeSetTravIdCurrent( pFanin );
        Abc_ObjTransferFanout( pNode, pFanin );
    }
    Counter = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
    return Counter;
}